

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab1-1.cpp
# Opt level: O0

void SortThreeNumbers(int *a,int *b,int *c)

{
  int iVar1;
  bool bVar2;
  int tmp_1;
  int tmp;
  int *c_local;
  int *b_local;
  int *a_local;
  
  while( true ) {
    bVar2 = true;
    if (*a <= *b) {
      bVar2 = *c < *b;
    }
    if (!bVar2) break;
    if (*b < *a) {
      iVar1 = *a;
      *a = *b;
      *b = iVar1;
    }
    else {
      if (*b <= *c) {
        return;
      }
      iVar1 = *b;
      *b = *c;
      *c = iVar1;
    }
  }
  return;
}

Assistant:

void SortThreeNumbers(int *a, int *b, int *c)
{
    while (*a > *b || *b > *c) {
        if (*a > *b) {
            int tmp = *a;
            *a = *b;
            *b = tmp;
        }
        else if (*b > *c)
        {
            int tmp = *b;
            *b = *c;
            *c = tmp;
        }
        else
        {
            break;
        }
    }
}